

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_traits.h
# Opt level: O2

optional<const_google::protobuf::FieldDescriptor_*> __thiscall
google::protobuf::json_internal::Proto2Descriptor::FieldByName
          (Proto2Descriptor *this,Desc *d,string_view name)

{
  bool bVar1;
  _Storage<const_google::protobuf::FieldDescriptor_*,_true> _Var2;
  ulong uVar3;
  undefined8 unaff_RBX;
  ulong uVar4;
  int i;
  int index;
  string_view camelcase_name;
  string_view name_00;
  basic_string_view<char,_std::char_traits<char>_> __y;
  optional<const_google::protobuf::FieldDescriptor_*> oVar5;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __x;
  
  camelcase_name._M_str = (char *)name._M_len;
  camelcase_name._M_len = (size_t)d;
  _Var2._M_value = Descriptor::FindFieldByCamelcaseName((Descriptor *)this,camelcase_name);
  uVar4 = CONCAT71((int7)((ulong)unaff_RBX >> 8),1);
  if ((_Var2._M_value == (FieldDescriptor *)0x0) &&
     (name_00._M_str = camelcase_name._M_str, name_00._M_len = (size_t)d,
     _Var2._M_value = Descriptor::FindFieldByName((Descriptor *)this,name_00),
     _Var2._M_value == (FieldDescriptor *)0x0)) {
    for (index = 0; index < *(int *)(this + 4); index = index + 1) {
      _Var2._M_value = Descriptor::field((Descriptor *)this,index);
      if ((((_Var2._M_value)->field_0x1 & 4) != 0) &&
         (uVar3 = (ulong)((byte)(_Var2._M_value)->field_0x3 & 0x70),
         __y._M_str = camelcase_name._M_str, __y._M_len = (size_t)d,
         __x._M_str = *(char **)((long)&((_Var2._M_value)->all_names_->_M_dataplus)._M_p + uVar3 * 2
                                ),
         __x._M_len = *(size_t *)((long)&(_Var2._M_value)->all_names_->_M_string_length + uVar3 * 2)
         , bVar1 = std::operator==(__x,__y), bVar1)) goto LAB_002985ec;
    }
    _Var2._M_value = (FieldDescriptor *)0x0;
    uVar4 = 0;
  }
LAB_002985ec:
  oVar5.super__Optional_base<const_google::protobuf::FieldDescriptor_*,_true,_true>._M_payload.
  super__Optional_payload_base<const_google::protobuf::FieldDescriptor_*>._8_8_ = uVar4 & 0xffffffff
  ;
  oVar5.super__Optional_base<const_google::protobuf::FieldDescriptor_*,_true,_true>._M_payload.
  super__Optional_payload_base<const_google::protobuf::FieldDescriptor_*>._M_payload._M_value =
       _Var2._M_value;
  return (optional<const_google::protobuf::FieldDescriptor_*>)
         oVar5.super__Optional_base<const_google::protobuf::FieldDescriptor_*,_true,_true>.
         _M_payload.super__Optional_payload_base<const_google::protobuf::FieldDescriptor_*>;
}

Assistant:

static absl::optional<Field> FieldByName(const Desc& d,
                                           absl::string_view name) {
    if (const auto* field = d.FindFieldByCamelcaseName(name)) {
      return field;
    }

    if (const auto* field = d.FindFieldByName(name)) {
      return field;
    }

    for (int i = 0; i < d.field_count(); ++i) {
      const auto* field = d.field(i);
      if (field->has_json_name() && field->json_name() == name) {
        return field;
      }
    }

    return absl::nullopt;
  }